

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O1

uint64_t fiobj_obj2hash(FIOBJ o)

{
  uint uVar1;
  uint64_t uVar2;
  char cVar3;
  fiobj_object_vtable_s *pfVar4;
  uint uVar5;
  fio_str_info_s s;
  fio_str_info_s local_18;
  
  uVar1 = (uint)o;
  if ((uVar1 & 7) == 2) {
    uVar2 = fiobj_str_hash(o);
    return uVar2;
  }
  uVar5 = uVar1 & 6;
  if (uVar5 == 6) {
    return o;
  }
  if (o == 0) {
    return 0;
  }
  if ((o & 1) != 0) {
    return o;
  }
  cVar3 = '(';
  switch(uVar5) {
  case 0:
switchD_00152478_caseD_0:
    cVar3 = *(char *)(o & 0xfffffffffffffff8);
    break;
  case 4:
switchD_00152478_caseD_4:
    cVar3 = '*';
    break;
  case 6:
    if ((char)o == '&') {
      local_18.data = anon_var_dwarf_21a;
      local_18.len._0_4_ = 5;
    }
    else if ((uVar1 & 0xff) == 0x16) {
      local_18.data = anon_var_dwarf_225;
      local_18.len._0_4_ = 4;
    }
    else {
      if ((uVar1 & 0xff) != 6) {
        switch(uVar5) {
        case 0:
          goto switchD_00152478_caseD_0;
        case 4:
          goto switchD_00152478_caseD_4;
        case 6:
          cVar3 = (char)o;
        }
        break;
      }
      local_18.data = anon_var_dwarf_20f;
      local_18.len._0_4_ = 4;
    }
    local_18.capa._0_4_ = 0;
    local_18.capa._4_4_ = 0;
    local_18.len._4_4_ = 0;
    goto LAB_00152543;
  }
  switch(cVar3) {
  case '\'':
    pfVar4 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar4 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar4 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar4 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar4 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar4 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar4->to_str)(&local_18,o);
LAB_00152543:
  uVar2 = fio_siphash13(local_18.data,CONCAT44(local_18.len._4_4_,(undefined4)local_18.len),0x144e87
                        ,0x1453b6);
  return uVar2;
}

Assistant:

FIO_INLINE uint64_t fiobj_obj2hash(const FIOBJ o) {
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_STRING))
    return fiobj_str_hash(o);
  if (!FIOBJ_IS_ALLOCATED(o))
    return (uint64_t)o;
  fio_str_info_s s = fiobj_obj2cstr(o);
  return FIO_HASH_FN(s.data, s.len, &fiobj_each2, &fiobj_free_complex_object);
}